

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O0

string * __thiscall RPCHelpMan::ToString_abi_cxx11_(RPCHelpMan *this)

{
  long lVar1;
  string_view pattern;
  string_view str;
  bool bVar2;
  bool bVar3;
  undefined8 uVar4;
  reference pRVar5;
  string *psVar6;
  const_reference pvVar7;
  Sections *this_00;
  RPCArg *arg_00;
  long lVar8;
  RPCResults *in_RSI;
  string *in_RDI;
  long in_FS_OFFSET;
  __sv_type _Var9;
  RPCArg *arg_inner;
  vector<RPCArg,_std::allocator<RPCArg>_> *__range3;
  value_type *arg_1;
  size_t i;
  bool optional;
  RPCArg *arg;
  vector<RPCArg,_std::allocator<RPCArg>_> *__range1;
  bool was_optional;
  string *ret;
  const_iterator __end3;
  const_iterator __begin3;
  Sections named_only_sections;
  Sections sections;
  const_iterator __end1;
  const_iterator __begin1;
  Section *in_stack_fffffffffffffc98;
  RPCArg *in_stack_fffffffffffffca0;
  Section *in_stack_fffffffffffffca8;
  RPCArg *in_stack_fffffffffffffcb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffcb8;
  const_reference right;
  string *left;
  undefined7 in_stack_fffffffffffffcc8;
  undefined1 in_stack_fffffffffffffccf;
  undefined7 in_stack_fffffffffffffd00;
  undefined7 uVar10;
  undefined1 in_stack_fffffffffffffd07;
  undefined1 is_named_arg;
  RPCArg *this_01;
  char *pcVar11;
  undefined7 in_stack_fffffffffffffd18;
  byte in_stack_fffffffffffffd1f;
  const_iterator in_stack_fffffffffffffd58;
  const_iterator in_stack_fffffffffffffd60;
  undefined8 local_250;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string(&in_stack_fffffffffffffcb0->m_names);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
            (&in_stack_fffffffffffffca8->m_left,&in_stack_fffffffffffffca0->m_names);
  bVar3 = false;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::begin
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffffca0);
  uVar4 = std::vector<RPCArg,_std::allocator<RPCArg>_>::end
                    ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffffca0);
  while ((bVar2 = __gnu_cxx::
                  operator==<const_RPCArg_*,_std::vector<RPCArg,_std::allocator<RPCArg>_>_>
                            ((__normal_iterator<const_RPCArg_*,_std::vector<RPCArg,_std::allocator<RPCArg>_>_>
                              *)in_stack_fffffffffffffca8,
                             (__normal_iterator<const_RPCArg_*,_std::vector<RPCArg,_std::allocator<RPCArg>_>_>
                              *)in_stack_fffffffffffffca0), ((bVar2 ^ 0xffU) & 1) != 0 &&
         (pRVar5 = __gnu_cxx::
                   __normal_iterator<const_RPCArg_*,_std::vector<RPCArg,_std::allocator<RPCArg>_>_>
                   ::operator*((__normal_iterator<const_RPCArg_*,_std::vector<RPCArg,_std::allocator<RPCArg>_>_>
                                *)in_stack_fffffffffffffc98), ((pRVar5->m_opts).hidden & 1U) == 0)))
  {
    in_stack_fffffffffffffccf = RPCArg::IsOptional(in_stack_fffffffffffffca0);
    in_stack_fffffffffffffd1f = in_stack_fffffffffffffccf;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              (&in_stack_fffffffffffffca8->m_left,(char *)in_stack_fffffffffffffca0);
    if ((in_stack_fffffffffffffd1f & 1) == 0) {
      if (bVar3) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                  (&in_stack_fffffffffffffca8->m_left,(char *)in_stack_fffffffffffffca0);
      }
      bVar3 = false;
    }
    else {
      if (!bVar3) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                  (&in_stack_fffffffffffffca8->m_left,(char *)in_stack_fffffffffffffca0);
      }
      bVar3 = true;
    }
    RPCArg::ToString_abi_cxx11_
              (in_stack_fffffffffffffd58._M_current,(bool)(char)((ulong)uVar4 >> 0x38));
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              (&in_stack_fffffffffffffca8->m_left,&in_stack_fffffffffffffca0->m_names);
    std::__cxx11::string::~string(&in_stack_fffffffffffffc98->m_left);
    __gnu_cxx::__normal_iterator<const_RPCArg_*,_std::vector<RPCArg,_std::allocator<RPCArg>_>_>::
    operator++((__normal_iterator<const_RPCArg_*,_std::vector<RPCArg,_std::allocator<RPCArg>_>_> *)
               in_stack_fffffffffffffc98);
  }
  if (bVar3) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              (&in_stack_fffffffffffffca8->m_left,(char *)in_stack_fffffffffffffca0);
  }
  _Var9 = std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffcb8);
  this_01 = (RPCArg *)_Var9._M_len;
  pcVar11 = _Var9._M_str;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffcb8,
             (char *)in_stack_fffffffffffffcb0);
  str._M_str._0_7_ = in_stack_fffffffffffffd18;
  str._M_len = (size_t)pcVar11;
  str._M_str._7_1_ = in_stack_fffffffffffffd1f;
  pattern._M_len._7_1_ = in_stack_fffffffffffffd07;
  pattern._M_len._0_7_ = in_stack_fffffffffffffd00;
  pattern._M_str = (char *)this_01;
  util::TrimString_abi_cxx11_(str,pattern);
  std::operator+((char *)in_stack_fffffffffffffcb0,&in_stack_fffffffffffffca8->m_left);
  std::operator+(&in_stack_fffffffffffffcb0->m_names,(char *)in_stack_fffffffffffffca8);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
            (&in_stack_fffffffffffffca8->m_left,&in_stack_fffffffffffffca0->m_names);
  std::__cxx11::string::~string(&in_stack_fffffffffffffc98->m_left);
  std::__cxx11::string::~string(&in_stack_fffffffffffffc98->m_left);
  std::__cxx11::string::~string(&in_stack_fffffffffffffc98->m_left);
  Sections::Sections((Sections *)in_stack_fffffffffffffc98);
  Sections::Sections((Sections *)in_stack_fffffffffffffc98);
  uVar10 = 0;
  is_named_arg = 0;
  while( true ) {
    left = (string *)CONCAT17(is_named_arg,uVar10);
    psVar6 = (string *)
             std::vector<RPCArg,_std::allocator<RPCArg>_>::size
                       ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffffc98);
    if ((psVar6 <= left) ||
       (pvVar7 = std::vector<RPCArg,_std::allocator<RPCArg>_>::at
                           ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffffca8,
                            (size_type)in_stack_fffffffffffffca0),
       ((pvVar7->m_opts).hidden & 1U) != 0)) break;
    in_stack_fffffffffffffcb0 = (RPCArg *)&stack0xfffffffffffffd98;
    this_00 = (Sections *)(CONCAT17(is_named_arg,uVar10) + 1);
    right = pvVar7;
    util::ToString<unsigned_long>((unsigned_long *)in_RDI);
    std::operator+(&in_stack_fffffffffffffcb0->m_names,(char *)in_stack_fffffffffffffca8);
    RPCArg::GetFirstName_abi_cxx11_(in_stack_fffffffffffffcb0);
    std::operator+(in_RDI,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT17(in_stack_fffffffffffffccf,in_stack_fffffffffffffcc8));
    RPCArg::ToDescriptionString_abi_cxx11_(this_01,(bool)is_named_arg);
    std::vector<Section,std::allocator<Section>>::
    emplace_back<std::__cxx11::string,std::__cxx11::string>
              ((vector<Section,_std::allocator<Section>_> *)right,
               &in_stack_fffffffffffffcb0->m_names,&in_stack_fffffffffffffca8->m_left);
    std::__cxx11::string::~string(&in_stack_fffffffffffffc98->m_left);
    std::__cxx11::string::~string(&in_stack_fffffffffffffc98->m_left);
    std::__cxx11::string::~string(&in_stack_fffffffffffffc98->m_left);
    std::__cxx11::string::~string(&in_stack_fffffffffffffc98->m_left);
    std::__cxx11::string::~string(&in_stack_fffffffffffffc98->m_left);
    in_stack_fffffffffffffca0 = (RPCArg *)&stack0xfffffffffffffdb0;
    std::vector<Section,_std::allocator<Section>_>::back
              ((vector<Section,_std::allocator<Section>_> *)in_stack_fffffffffffffc98);
    arg_00 = (RPCArg *)
             std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                       (&in_stack_fffffffffffffc98->m_left);
    in_stack_fffffffffffffca8 =
         (Section *)
         std::max<unsigned_long>
                   ((unsigned_long *)in_stack_fffffffffffffca0,
                    (unsigned_long *)in_stack_fffffffffffffc98);
    local_250 = (in_stack_fffffffffffffca8->m_left)._M_dataplus._M_p;
    Sections::Push(this_00,arg_00,(size_t)in_stack_fffffffffffffd60._M_current,
                   (OuterType)((ulong)in_stack_fffffffffffffd58._M_current >> 0x20));
    if (pvVar7->m_type == OBJ_NAMED_PARAMS) {
      in_stack_fffffffffffffd60 =
           std::vector<RPCArg,_std::allocator<RPCArg>_>::begin(in_stack_fffffffffffffca0);
      in_stack_fffffffffffffd58 =
           std::vector<RPCArg,_std::allocator<RPCArg>_>::end(in_stack_fffffffffffffca0);
      while (bVar3 = __gnu_cxx::
                     operator==<const_RPCArg_*,_std::vector<RPCArg,_std::allocator<RPCArg>_>_>
                               ((__normal_iterator<const_RPCArg_*,_std::vector<RPCArg,_std::allocator<RPCArg>_>_>
                                 *)in_stack_fffffffffffffca8,
                                (__normal_iterator<const_RPCArg_*,_std::vector<RPCArg,_std::allocator<RPCArg>_>_>
                                 *)in_stack_fffffffffffffca0), ((bVar3 ^ 0xffU) & 1) != 0) {
        __gnu_cxx::__normal_iterator<const_RPCArg_*,_std::vector<RPCArg,_std::allocator<RPCArg>_>_>
        ::operator*((__normal_iterator<const_RPCArg_*,_std::vector<RPCArg,_std::allocator<RPCArg>_>_>
                     *)in_stack_fffffffffffffc98);
        RPCArg::GetFirstName_abi_cxx11_(in_stack_fffffffffffffcb0);
        RPCArg::ToDescriptionString_abi_cxx11_(this_01,(bool)is_named_arg);
        Section::Section((Section *)CONCAT17(in_stack_fffffffffffffccf,in_stack_fffffffffffffcc8),
                         left,&right->m_names);
        Sections::PushSection((Sections *)in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
        Section::~Section(in_stack_fffffffffffffc98);
        std::__cxx11::string::~string(&in_stack_fffffffffffffc98->m_left);
        std::__cxx11::string::~string(&in_stack_fffffffffffffc98->m_left);
        Sections::Push(this_00,arg_00,(size_t)in_stack_fffffffffffffd60._M_current,
                       (OuterType)((ulong)in_stack_fffffffffffffd58._M_current >> 0x20));
        __gnu_cxx::__normal_iterator<const_RPCArg_*,_std::vector<RPCArg,_std::allocator<RPCArg>_>_>
        ::operator++((__normal_iterator<const_RPCArg_*,_std::vector<RPCArg,_std::allocator<RPCArg>_>_>
                      *)in_stack_fffffffffffffc98);
      }
    }
    lVar8 = CONCAT17(is_named_arg,uVar10) + 1;
    uVar10 = (undefined7)lVar8;
    is_named_arg = (undefined1)((ulong)lVar8 >> 0x38);
  }
  bVar3 = std::vector<Section,_std::allocator<Section>_>::empty
                    ((vector<Section,_std::allocator<Section>_> *)in_stack_fffffffffffffca8);
  if (!bVar3) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              (&in_stack_fffffffffffffca8->m_left,(char *)in_stack_fffffffffffffca0);
  }
  Sections::ToString_abi_cxx11_((Sections *)this_01);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
            (&in_stack_fffffffffffffca8->m_left,&in_stack_fffffffffffffca0->m_names);
  std::__cxx11::string::~string(&in_stack_fffffffffffffc98->m_left);
  bVar3 = std::vector<Section,_std::allocator<Section>_>::empty
                    ((vector<Section,_std::allocator<Section>_> *)in_stack_fffffffffffffca8);
  if (!bVar3) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              (&in_stack_fffffffffffffca8->m_left,(char *)in_stack_fffffffffffffca0);
  }
  Sections::ToString_abi_cxx11_((Sections *)this_01);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
            (&in_stack_fffffffffffffca8->m_left,&in_stack_fffffffffffffca0->m_names);
  std::__cxx11::string::~string(&in_stack_fffffffffffffc98->m_left);
  RPCResults::ToDescriptionString_abi_cxx11_(in_RSI);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
            (&in_stack_fffffffffffffca8->m_left,&in_stack_fffffffffffffca0->m_names);
  std::__cxx11::string::~string(&in_stack_fffffffffffffc98->m_left);
  RPCExamples::ToDescriptionString_abi_cxx11_((RPCExamples *)in_stack_fffffffffffffcb0);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
            (&in_stack_fffffffffffffca8->m_left,&in_stack_fffffffffffffca0->m_names);
  std::__cxx11::string::~string(&in_stack_fffffffffffffc98->m_left);
  Sections::~Sections((Sections *)in_stack_fffffffffffffc98);
  Sections::~Sections((Sections *)in_stack_fffffffffffffc98);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

std::string RPCHelpMan::ToString() const
{
    std::string ret;

    // Oneline summary
    ret += m_name;
    bool was_optional{false};
    for (const auto& arg : m_args) {
        if (arg.m_opts.hidden) break; // Any arg that follows is also hidden
        const bool optional = arg.IsOptional();
        ret += " ";
        if (optional) {
            if (!was_optional) ret += "( ";
            was_optional = true;
        } else {
            if (was_optional) ret += ") ";
            was_optional = false;
        }
        ret += arg.ToString(/*oneline=*/true);
    }
    if (was_optional) ret += " )";

    // Description
    ret += "\n\n" + TrimString(m_description) + "\n";

    // Arguments
    Sections sections;
    Sections named_only_sections;
    for (size_t i{0}; i < m_args.size(); ++i) {
        const auto& arg = m_args.at(i);
        if (arg.m_opts.hidden) break; // Any arg that follows is also hidden

        // Push named argument name and description
        sections.m_sections.emplace_back(util::ToString(i + 1) + ". " + arg.GetFirstName(), arg.ToDescriptionString(/*is_named_arg=*/true));
        sections.m_max_pad = std::max(sections.m_max_pad, sections.m_sections.back().m_left.size());

        // Recursively push nested args
        sections.Push(arg);

        // Push named-only argument sections
        if (arg.m_type == RPCArg::Type::OBJ_NAMED_PARAMS) {
            for (const auto& arg_inner : arg.m_inner) {
                named_only_sections.PushSection({arg_inner.GetFirstName(), arg_inner.ToDescriptionString(/*is_named_arg=*/true)});
                named_only_sections.Push(arg_inner);
            }
        }
    }

    if (!sections.m_sections.empty()) ret += "\nArguments:\n";
    ret += sections.ToString();
    if (!named_only_sections.m_sections.empty()) ret += "\nNamed Arguments:\n";
    ret += named_only_sections.ToString();

    // Result
    ret += m_results.ToDescriptionString();

    // Examples
    ret += m_examples.ToDescriptionString();

    return ret;
}